

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

EnumVal * __thiscall
flatbuffers::EnumValBuilder::CreateEnumerator(EnumValBuilder *this,string *ev_name)

{
  pointer ppEVar1;
  pointer ppEVar2;
  pointer pcVar3;
  EnumVal *pEVar4;
  _Rb_tree_header *p_Var5;
  int64_t iVar6;
  
  if (this->temp == (EnumVal *)0x0) {
    ppEVar1 = (this->enum_def->vals).vec.
              super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppEVar2 = (this->enum_def->vals).vec.
              super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    this->user_value = ppEVar1 == ppEVar2;
    pEVar4 = (EnumVal *)operator_new(0xa8);
    if (ppEVar1 == ppEVar2) {
      iVar6 = 0;
    }
    else {
      iVar6 = ppEVar2[-1]->value;
    }
    (pEVar4->name)._M_dataplus._M_p = (pointer)&(pEVar4->name).field_2;
    pcVar3 = (ev_name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)pEVar4,pcVar3,pcVar3 + ev_name->_M_string_length);
    p_Var5 = &(pEVar4->attributes).dict._M_t._M_impl.super__Rb_tree_header;
    (pEVar4->attributes).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (pEVar4->attributes).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (pEVar4->doc_comment).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pEVar4->doc_comment).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pEVar4->doc_comment).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pEVar4->union_type).base_type = BASE_TYPE_NONE;
    (pEVar4->union_type).element = BASE_TYPE_NONE;
    (pEVar4->union_type).struct_def = (StructDef *)0x0;
    (pEVar4->union_type).enum_def = (EnumDef *)0x0;
    (pEVar4->union_type).fixed_length = 0;
    (pEVar4->attributes).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var5->_M_header;
    (pEVar4->attributes).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var5->_M_header;
    (pEVar4->attributes).dict._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    (pEVar4->attributes).vec.
    super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pEVar4->attributes).vec.
    super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pEVar4->attributes).vec.
    super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pEVar4->value = iVar6;
    this->temp = pEVar4;
    return pEVar4;
  }
  __assert_fail("!temp",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                ,0x951,"EnumVal *flatbuffers::EnumValBuilder::CreateEnumerator(const std::string &)"
               );
}

Assistant:

EnumVal *CreateEnumerator(const std::string &ev_name) {
    FLATBUFFERS_ASSERT(!temp);
    auto first = enum_def.vals.vec.empty();
    user_value = first;
    temp = new EnumVal(ev_name, first ? 0 : enum_def.vals.vec.back()->value);
    return temp;
  }